

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Int32_To_Int24(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                   int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  PaInt32 *src;
  uchar *dest;
  undefined1 *puVar1;
  bool bVar2;
  
  puVar1 = (undefined1 *)((long)destinationBuffer + 2);
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    puVar1[-2] = *(undefined1 *)((long)sourceBuffer + 1);
    puVar1[-1] = *(undefined1 *)((long)sourceBuffer + 2);
    *puVar1 = *(undefined1 *)((long)sourceBuffer + 3);
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
    puVar1 = puVar1 + destinationStride * 3;
  }
  return;
}

Assistant:

static void Int32_To_Int24(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    PaInt32 *src    = (PaInt32*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;
    (void) ditherGenerator; /* unused parameter */

    while( count-- )
    {
        /* REVIEW */
#if defined(PA_LITTLE_ENDIAN)
        dest[0] = (unsigned char)(*src >> 8);
        dest[1] = (unsigned char)(*src >> 16);
        dest[2] = (unsigned char)(*src >> 24);
#elif defined(PA_BIG_ENDIAN)
        dest[0] = (unsigned char)(*src >> 24);
        dest[1] = (unsigned char)(*src >> 16);
        dest[2] = (unsigned char)(*src >> 8);
#endif
        src += sourceStride;
        dest += destinationStride * 3;
    }
}